

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

void binaryFilter(Mat *image,double factor)

{
  _InputArray *p_Var1;
  int y;
  long lVar2;
  long lVar3;
  int x;
  long lVar4;
  double max;
  double min;
  Mat out;
  double local_98;
  _InputArray local_90;
  double local_78;
  Mat local_70 [8];
  int local_68;
  int local_64;
  long local_60;
  long *local_28;
  
  cv::Mat::clone();
  local_90.sz.width = 0;
  local_90.sz.height = 0;
  local_90.flags = 0x1010000;
  local_90.obj = local_70;
  p_Var1 = (_InputArray *)cv::noArray();
  cv::minMaxLoc(&local_90,&local_78,&local_98,(Point_ *)0x0,(Point_ *)0x0,p_Var1);
  for (lVar4 = 0; lVar4 < local_64; lVar4 = lVar4 + 1) {
    for (lVar2 = 0; lVar2 < local_68; lVar2 = lVar2 + 1) {
      lVar3 = *local_28 * lVar2 + local_60;
      *(char *)(lVar4 + lVar3) = -((byte)(int)(factor * local_98) < *(byte *)(lVar4 + lVar3));
    }
  }
  cv::Mat::operator=(image,local_70);
  cv::Mat::~Mat(local_70);
  return;
}

Assistant:

void binaryFilter(cv::Mat & image, double factor) {
	cv::Mat out = image.clone();
	double min, max;
	cv::minMaxLoc(out, &min, &max);
	uchar threshold = (uchar)(max * factor);
	for (int x = 0; x < out.cols; x++)
	{
		for (int y = 0; y < out.rows; y++)
		{
			if (out.at<uchar>(cv::Point(x, y)) > threshold)
				out.at<uchar>(cv::Point(x, y)) = UCHAR_MAX;
			else
				out.at<uchar>(cv::Point(x, y)) = 0;
		}
	}
	image = out;
}